

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O3

int16_t WebRtcIsac_UpdateBandwidthEstimator
                  (BwEstimatorstr *bwest_str,uint16_t rtp_number,int32_t frame_length,
                  uint32_t send_ts,uint32_t arr_ts,size_t pksize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  bool bVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  short sVar8;
  uint uVar9;
  double dVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  
  if ((bwest_str->external_bw_info).in_use != 0) {
    __assert_fail("!bwest_str->external_bw_info.in_use",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/main/source/bandwidth_estimator.c"
                  ,0xa2,
                  "int16_t WebRtcIsac_UpdateBandwidthEstimator(BwEstimatorstr *, const uint16_t, const int32_t, const uint32_t, const uint32_t, const size_t)"
                 );
  }
  iVar7 = bwest_str->prev_frame_length;
  fVar17 = (float)frame_length;
  if (iVar7 == frame_length) {
    fVar20 = bwest_str->rec_header_rate;
  }
  else {
    fVar20 = 280000.0 / fVar17;
    bwest_str->rec_header_rate = fVar20;
  }
  fVar20 = ((float)pksize * 8.0 * 1000.0) / fVar17 + fVar20;
  if (arr_ts < bwest_str->prev_rec_arr_ts) {
    bwest_str->prev_rec_arr_ts = arr_ts;
    bwest_str->last_update_ts = arr_ts;
    bwest_str->last_reduction_ts = arr_ts + 48000;
    bwest_str->num_pkts_rec = 0;
    bwest_str->prev_frame_length = frame_length;
    bwest_str->prev_rec_rtp_rate = fVar20;
    bwest_str->prev_rec_rtp_number = (uint)rtp_number;
    return 0;
  }
  iVar6 = bwest_str->num_pkts_rec + 1;
  bwest_str->num_pkts_rec = iVar6;
  if (bwest_str->count_tot_updates_rec < 1) {
    bwest_str->last_update_ts = arr_ts;
    bwest_str->last_reduction_ts = arr_ts + 48000;
    bwest_str->num_pkts_rec = 0;
    bwest_str->count_tot_updates_rec = bwest_str->count_tot_updates_rec + 1;
    bVar4 = false;
    fVar13 = 1.0;
    goto LAB_00151e5f;
  }
  if (0 < bwest_str->in_wait_period) {
    bwest_str->in_wait_period = bwest_str->in_wait_period + -1;
  }
  uVar3 = bwest_str->prev_rec_send_ts;
  sVar8 = (short)*(undefined4 *)&bwest_str->inWaitLatePkts;
  fVar13 = (float)(send_ts - uVar3);
  bwest_str->inWaitLatePkts = sVar8 - (ushort)(0 < sVar8);
  if (fVar13 <= (float)(frame_length << 5)) {
    fVar14 = ((float)(arr_ts - bwest_str->last_update_ts) * 1000.0) / 16000.0;
    if (3000.0 < fVar14) {
      if ((float)iVar6 / (float)(int)(fVar14 / fVar17) <= 0.9) goto LAB_001519e7;
      dVar10 = pow(0.99995,(double)(((float)(arr_ts - bwest_str->last_reduction_ts) * 1000.0) /
                                   16000.0));
      fVar14 = (float)dVar10;
      if ((fVar14 != 0.0) || (NAN(fVar14))) {
        fVar14 = bwest_str->rec_bw_inv / fVar14;
        bwest_str->rec_bw_inv = fVar14;
        if ((bwest_str->hsn_detect_snd != 0) &&
           ((bwest_str->hsn_detect_rec != 0 && (6.6e-05 < fVar14)))) {
          fVar14 = 6.6e-05;
          goto LAB_00151b3e;
        }
      }
      else {
        fVar14 = 4.054054e-05;
LAB_00151b3e:
        bwest_str->rec_bw_inv = fVar14;
      }
      bwest_str->last_reduction_ts = arr_ts;
      iVar7 = bwest_str->prev_frame_length;
    }
  }
  else {
LAB_001519e7:
    bwest_str->last_reduction_ts = arr_ts + 48000;
    bwest_str->last_update_ts = arr_ts;
    bwest_str->num_pkts_rec = 0;
  }
  if (iVar7 != frame_length) {
    bwest_str->count_tot_updates_rec = 10;
    bwest_str->rec_header_rate = 280000.0 / fVar17;
    bwest_str->rec_bw_inv = 1.0 / ((float)bwest_str->rec_bw + 280000.0 / fVar17);
  }
  fVar12 = (float)(arr_ts - bwest_str->prev_rec_arr_ts);
  fVar11 = (float)(frame_length << 4);
  fVar14 = fVar11;
  if (send_ts != uVar3) {
    fVar14 = fVar13;
  }
  fVar14 = fVar12 - fVar14;
  if ((fVar14 <= 0.0) || (bwest_str->inWaitLatePkts != 0)) {
    bwest_str->numConsecLatePkts = 0;
    bwest_str->consecLatency = 0.0;
LAB_00151bcd:
    bVar4 = false;
    fVar13 = 1.0;
  }
  else {
    uVar9 = *(int *)&bwest_str->numConsecLatePkts + 1;
    uVar5 = (ushort)uVar9;
    bwest_str->numConsecLatePkts = uVar5;
    fVar16 = bwest_str->consecLatency + fVar14;
    bwest_str->consecLatency = fVar16;
    if (uVar5 < 0x33) goto LAB_00151bcd;
    fVar16 = fVar16 * 0.0625;
    fVar13 = fVar17 / (fVar16 / (float)(uVar9 & 0xffff) + fVar17);
    bwest_str->inWaitLatePkts = (int16_t)(int)(fVar16 / 30.0);
    bwest_str->start_wait_period = arr_ts;
    bVar4 = true;
  }
  if (bwest_str->prev_rec_rtp_number + 1U != (uint)rtp_number) goto LAB_00151e5f;
  if (((bwest_str->hsn_detect_snd == 0) || (bwest_str->hsn_detect_rec == 0)) && (fVar11 < fVar12)) {
    if ((fVar14 <= 8000.0) || (bwest_str->in_wait_period != 0)) {
      if ((fVar14 <= 5120.0) || (bwest_str->in_wait_period != 0)) goto LAB_00151cb8;
      fVar13 = 0.8;
      iVar7 = 0x2c;
    }
    else {
      fVar13 = 0.7;
      iVar7 = 0x37;
    }
    bwest_str->in_wait_period = iVar7;
    bwest_str->start_wait_period = arr_ts;
    bVar4 = true;
  }
LAB_00151cb8:
  fVar14 = bwest_str->rec_bw_avg;
  if (((fVar14 < bwest_str->prev_rec_rtp_rate) && (fVar14 < fVar20)) &&
     (bwest_str->in_wait_period == 0)) {
    iVar6 = bwest_str->count_tot_updates_rec;
    iVar7 = iVar6 + 1;
    bwest_str->count_tot_updates_rec = iVar7;
    if (iVar6 < 100) {
      fVar16 = 1.0 / (float)iVar7;
    }
    else {
      fVar16 = 0.01;
    }
    fVar15 = fVar11 + 400.0;
    if (fVar12 <= fVar11 + 400.0) {
      fVar15 = fVar12;
    }
    uVar9 = -(uint)(fVar15 < fVar11 + -160.0);
    fVar12 = (float)(~uVar9 & (uint)fVar15 | (uint)((fVar17 * 16000.0) / 1000.0 + -160.0) & uVar9);
    fVar11 = (float)(pksize + 0x23) * 8.0;
    auVar18._4_12_ = DAT_0019feb0._4_12_;
    auVar18._0_4_ = fVar12;
    auVar19._4_4_ = bwest_str->rec_header_rate + 56000.0;
    auVar19._0_4_ = fVar11 * 16000.0;
    auVar19._8_8_ = 0;
    auVar19 = divps(auVar18,auVar19);
    fVar17 = auVar19._4_4_;
    if (auVar19._4_4_ <= auVar19._0_4_) {
      fVar17 = auVar19._0_4_;
    }
    bwest_str->rec_bw_inv = fVar17 * fVar16 + bwest_str->rec_bw_inv * (1.0 - fVar16);
    bwest_str->last_update_ts = arr_ts;
    bwest_str->last_reduction_ts = arr_ts + 48000;
    bwest_str->num_pkts_rec = 0;
    fVar11 = (fVar12 * 1000.0) / 16000.0 - (fVar11 * 1000.0) / fVar14;
    fVar14 = ABS(fVar11);
    fVar12 = fVar16 * fVar14 + (1.0 - fVar16) * bwest_str->rec_jitter;
    fVar17 = 10.0;
    if (fVar12 <= 10.0) {
      fVar17 = fVar12;
    }
    bwest_str->rec_jitter = fVar17;
    uVar1 = bwest_str->rec_jitter_short_term;
    uVar2 = bwest_str->rec_jitter_short_term_abs;
    bwest_str->rec_jitter_short_term = fVar11 * 0.05 + (float)uVar1 * (float)0x3f733333;
    bwest_str->rec_jitter_short_term_abs = fVar14 * 0.05 + (float)uVar2 * (float)0x3f733333;
  }
LAB_00151e5f:
  fVar17 = bwest_str->rec_bw_inv;
  fVar14 = bwest_str->rec_header_rate;
  fVar12 = 1.0 / (fVar14 + 10000.0);
  fVar11 = fVar12;
  if (fVar17 <= fVar12) {
    fVar11 = fVar17;
  }
  fVar15 = 1.0 / (fVar14 + 56000.0);
  fVar16 = fVar15;
  if (fVar15 <= fVar11) {
    fVar16 = fVar11;
  }
  if (fVar11 < fVar15 || fVar12 < fVar17) {
    bwest_str->rec_bw_inv = fVar16;
  }
  bwest_str->prev_frame_length = frame_length;
  bwest_str->prev_rec_rtp_rate = fVar20;
  bwest_str->prev_rec_rtp_number = (uint)rtp_number;
  bwest_str->rec_max_delay = bwest_str->rec_jitter * 3.0;
  bwest_str->prev_rec_arr_ts = arr_ts;
  bwest_str->prev_rec_send_ts = send_ts;
  iVar7 = (int)(1.0 / fVar16 - fVar14);
  bwest_str->rec_bw = iVar7;
  if (bVar4) {
    iVar6 = (int)(fVar13 * (float)iVar7);
    iVar7 = 10000;
    if (10000 < iVar6) {
      iVar7 = iVar6;
    }
    bwest_str->rec_bw = iVar7;
    fVar14 = fVar14 + (float)iVar7;
    bwest_str->rec_bw_avg = fVar14;
    bwest_str->rec_bw_avg_Q = (float)iVar7;
    bwest_str->rec_jitter_short_term = 0.0;
    bwest_str->rec_bw_inv = 1.0 / fVar14;
    bwest_str->count_tot_updates_rec = 1;
    bwest_str->consecLatency = 0.0;
    bwest_str->numConsecLatePkts = 0;
  }
  return 0;
}

Assistant:

int16_t WebRtcIsac_UpdateBandwidthEstimator(
    BwEstimatorstr* bwest_str,
    const uint16_t rtp_number,
    const int32_t frame_length,
    const uint32_t send_ts,
    const uint32_t arr_ts,
    const size_t pksize
    /*,    const uint16_t Index*/)
{
  float weight = 0.0f;
  float curr_bw_inv = 0.0f;
  float rec_rtp_rate;
  float t_diff_proj;
  float arr_ts_diff;
  float send_ts_diff;
  float arr_time_noise;
  float arr_time_noise_abs;

  float delay_correction_factor = 1;
  float late_diff = 0.0f;
  int immediate_set = 0;
  int num_pkts_expected;

  assert(!bwest_str->external_bw_info.in_use);

  // We have to adjust the header-rate if the first packet has a
  // frame-size different than the initialized value.
  if ( frame_length != bwest_str->prev_frame_length )
  {
    bwest_str->rec_header_rate = (float)HEADER_SIZE * 8.0f *
        1000.0f / (float)frame_length;     /* bits/s */
  }

  /* UPDATE ESTIMATES ON THIS SIDE */
  /* compute far-side transmission rate */
  rec_rtp_rate = ((float)pksize * 8.0f * 1000.0f / (float)frame_length) +
      bwest_str->rec_header_rate;
  // rec_rtp_rate packet bits/s + header bits/s

  /* check for timer wrap-around */
  if (arr_ts < bwest_str->prev_rec_arr_ts)
  {
    bwest_str->prev_rec_arr_ts   = arr_ts;
    bwest_str->last_update_ts    = arr_ts;
    bwest_str->last_reduction_ts = arr_ts + 3*FS;
    bwest_str->num_pkts_rec      = 0;

    /* store frame length */
    bwest_str->prev_frame_length = frame_length;

    /* store far-side transmission rate */
    bwest_str->prev_rec_rtp_rate = rec_rtp_rate;

    /* store far-side RTP time stamp */
    bwest_str->prev_rec_rtp_number = rtp_number;

    return 0;
  }

  bwest_str->num_pkts_rec++;

  /* check that it's not one of the first 9 packets */
  if ( bwest_str->count_tot_updates_rec > 0 )
  {
    if(bwest_str->in_wait_period > 0 )
    {
      bwest_str->in_wait_period--;
    }

    bwest_str->inWaitLatePkts -= ((bwest_str->inWaitLatePkts > 0)? 1:0);
    send_ts_diff = (float)(send_ts - bwest_str->prev_rec_send_ts);

    if (send_ts_diff <= (16 * frame_length)*2)
      //doesn't allow for a dropped packet, not sure necessary to be
      // that strict -DH
    {
      /* if not been updated for a long time, reduce the BN estimate */
      if((uint32_t)(arr_ts - bwest_str->last_update_ts) *
         1000.0f / FS > 3000)
      {
        //how many frames should have been received since the last
        // update if too many have been dropped or there have been
        // big delays won't allow this reduction may no longer need
        // the send_ts_diff here
        num_pkts_expected = (int)(((float)(arr_ts -
                                           bwest_str->last_update_ts) * 1000.0f /(float) FS) /
                                  (float)frame_length);

        if(((float)bwest_str->num_pkts_rec/(float)num_pkts_expected) >
           0.9)
        {
          float inv_bitrate = (float) pow( 0.99995,
                                           (double)((uint32_t)(arr_ts -
                                                                     bwest_str->last_reduction_ts)*1000.0f/FS) );

          if ( inv_bitrate )
          {
            bwest_str->rec_bw_inv /= inv_bitrate;

            //precautionary, likely never necessary
            if (bwest_str->hsn_detect_snd &&
                bwest_str->hsn_detect_rec)
            {
              if (bwest_str->rec_bw_inv > 0.000066f)
              {
                bwest_str->rec_bw_inv = 0.000066f;
              }
            }
          }
          else
          {
            bwest_str->rec_bw_inv = 1.0f /
                (INIT_BN_EST_WB + INIT_HDR_RATE_WB);
          }
          /* reset time-since-update counter */
          bwest_str->last_reduction_ts = arr_ts;
        }
        else
          //reset here?
        {
          bwest_str->last_reduction_ts = arr_ts + 3*FS;
          bwest_str->last_update_ts = arr_ts;
          bwest_str->num_pkts_rec = 0;
        }
      }
    }
    else
    {
      bwest_str->last_reduction_ts = arr_ts + 3*FS;
      bwest_str->last_update_ts = arr_ts;
      bwest_str->num_pkts_rec = 0;
    }


    /* temporarily speed up adaptation if frame length has changed */
    if ( frame_length != bwest_str->prev_frame_length )
    {
      bwest_str->count_tot_updates_rec = 10;
      bwest_str->rec_header_rate = (float)HEADER_SIZE * 8.0f *
          1000.0f / (float)frame_length;     /* bits/s */

      bwest_str->rec_bw_inv = 1.0f /((float)bwest_str->rec_bw +
                                     bwest_str->rec_header_rate);
    }

    ////////////////////////
    arr_ts_diff = (float)(arr_ts - bwest_str->prev_rec_arr_ts);

    if (send_ts_diff > 0 )
    {
      late_diff = arr_ts_diff - send_ts_diff;
    }
    else
    {
      late_diff = arr_ts_diff - (float)(16 * frame_length);
    }

    if((late_diff > 0) && !bwest_str->inWaitLatePkts)
    {
      bwest_str->numConsecLatePkts++;
      bwest_str->consecLatency += late_diff;
    }
    else
    {
      bwest_str->numConsecLatePkts = 0;
      bwest_str->consecLatency = 0;
    }
    if(bwest_str->numConsecLatePkts > 50)
    {
      float latencyMs = bwest_str->consecLatency/(FS/1000);
      float averageLatencyMs = latencyMs / bwest_str->numConsecLatePkts;
      delay_correction_factor = frame_length / (frame_length + averageLatencyMs);
      immediate_set = 1;
      bwest_str->inWaitLatePkts = (int16_t)((bwest_str->consecLatency/(FS/1000)) / 30);// + 150;
      bwest_str->start_wait_period = arr_ts;
    }
    ///////////////////////////////////////////////



    /*   update only if previous packet was not lost */
    if ( rtp_number == bwest_str->prev_rec_rtp_number + 1 )
    {


      if (!(bwest_str->hsn_detect_snd && bwest_str->hsn_detect_rec))
      {
        if ((arr_ts_diff > (float)(16 * frame_length)))
        {
          //1/2 second
          if ((late_diff > 8000.0f) && !bwest_str->in_wait_period)
          {
            delay_correction_factor = 0.7f;
            bwest_str->in_wait_period = 55;
            bwest_str->start_wait_period = arr_ts;
            immediate_set = 1;
          }
          //320 ms
          else if (late_diff > 5120.0f && !bwest_str->in_wait_period)
          {
            delay_correction_factor = 0.8f;
            immediate_set = 1;
            bwest_str->in_wait_period = 44;
            bwest_str->start_wait_period = arr_ts;
          }
        }
      }


      if ((bwest_str->prev_rec_rtp_rate > bwest_str->rec_bw_avg) &&
          (rec_rtp_rate > bwest_str->rec_bw_avg)                 &&
          !bwest_str->in_wait_period)
      {
        /* test if still in initiation period and increment counter */
        if (bwest_str->count_tot_updates_rec++ > 99)
        {
          /* constant weight after initiation part */
          weight = 0.01f;
        }
        else
        {
          /* weight decreases with number of updates */
          weight = 1.0f / (float) bwest_str->count_tot_updates_rec;
        }
        /* Bottle Neck Estimation */

        /* limit outliers */
        /* if more than 25 ms too much */
        if (arr_ts_diff > frame_length * FS/1000 + 400.0f)
        {
          // in samples,  why 25ms??
          arr_ts_diff = frame_length * FS/1000 + 400.0f;
        }
        if(arr_ts_diff < (frame_length * FS/1000) - 160.0f)
        {
          /* don't allow it to be less than frame rate - 10 ms */
          arr_ts_diff = (float)frame_length * FS/1000 - 160.0f;
        }

        /* compute inverse receiving rate for last packet */
        curr_bw_inv = arr_ts_diff / ((float)(pksize + HEADER_SIZE) *
                                     8.0f * FS); // (180+35)*8*16000 = 27.5 Mbit....


        if(curr_bw_inv <
           (1.0f / (MAX_ISAC_BW + bwest_str->rec_header_rate)))
        {
          // don't allow inv rate to be larger than MAX
          curr_bw_inv = (1.0f /
                         (MAX_ISAC_BW + bwest_str->rec_header_rate));
        }

        /* update bottle neck rate estimate */
        bwest_str->rec_bw_inv = weight * curr_bw_inv +
            (1.0f - weight) * bwest_str->rec_bw_inv;

        /* reset time-since-update counter */
        bwest_str->last_update_ts    = arr_ts;
        bwest_str->last_reduction_ts = arr_ts + 3 * FS;
        bwest_str->num_pkts_rec = 0;

        /* Jitter Estimation */
        /* projected difference between arrival times */
        t_diff_proj = ((float)(pksize + HEADER_SIZE) * 8.0f *
                       1000.0f) / bwest_str->rec_bw_avg;


        // difference between projected and actual
        //   arrival time differences
        arr_time_noise = (float)(arr_ts_diff*1000.0f/FS) -
            t_diff_proj;
        arr_time_noise_abs = (float) fabs( arr_time_noise );

        /* long term averaged absolute jitter */
        bwest_str->rec_jitter = weight * arr_time_noise_abs +
            (1.0f - weight) * bwest_str->rec_jitter;
        if (bwest_str->rec_jitter > 10.0f)
        {
          bwest_str->rec_jitter = 10.0f;
        }
        /* short term averaged absolute jitter */
        bwest_str->rec_jitter_short_term_abs = 0.05f *
            arr_time_noise_abs + 0.95f *
            bwest_str->rec_jitter_short_term_abs;

        /* short term averaged jitter */
        bwest_str->rec_jitter_short_term = 0.05f * arr_time_noise +
            0.95f * bwest_str->rec_jitter_short_term;
      }
    }
  }
  else
  {
    // reset time-since-update counter when
    // receiving the first 9 packets
    bwest_str->last_update_ts    = arr_ts;
    bwest_str->last_reduction_ts = arr_ts + 3*FS;
    bwest_str->num_pkts_rec = 0;

    bwest_str->count_tot_updates_rec++;
  }

  /* limit minimum bottle neck rate */
  if (bwest_str->rec_bw_inv > 1.0f / ((float)MIN_ISAC_BW +
                                      bwest_str->rec_header_rate))
  {
    bwest_str->rec_bw_inv = 1.0f / ((float)MIN_ISAC_BW +
                                    bwest_str->rec_header_rate);
  }

  // limit maximum bitrate
  if (bwest_str->rec_bw_inv < 1.0f / ((float)MAX_ISAC_BW +
                                      bwest_str->rec_header_rate))
  {
    bwest_str->rec_bw_inv = 1.0f / ((float)MAX_ISAC_BW +
                                    bwest_str->rec_header_rate);
  }

  /* store frame length */
  bwest_str->prev_frame_length = frame_length;

  /* store far-side transmission rate */
  bwest_str->prev_rec_rtp_rate = rec_rtp_rate;

  /* store far-side RTP time stamp */
  bwest_str->prev_rec_rtp_number = rtp_number;

  // Replace bwest_str->rec_max_delay by the new
  // value (atomic operation)
  bwest_str->rec_max_delay = 3.0f * bwest_str->rec_jitter;

  /* store send and arrival time stamp */
  bwest_str->prev_rec_arr_ts = arr_ts ;
  bwest_str->prev_rec_send_ts = send_ts;

  /* Replace bwest_str->rec_bw by the new value (atomic operation) */
  bwest_str->rec_bw = (int32_t)(1.0f / bwest_str->rec_bw_inv -
                                      bwest_str->rec_header_rate);

  if (immediate_set)
  {
    bwest_str->rec_bw = (int32_t) (delay_correction_factor *
                                         (float) bwest_str->rec_bw);

    if (bwest_str->rec_bw < (int32_t) MIN_ISAC_BW)
    {
      bwest_str->rec_bw = (int32_t) MIN_ISAC_BW;
    }

    bwest_str->rec_bw_avg = bwest_str->rec_bw +
        bwest_str->rec_header_rate;

    bwest_str->rec_bw_avg_Q = (float) bwest_str->rec_bw;

    bwest_str->rec_jitter_short_term = 0.0f;

    bwest_str->rec_bw_inv = 1.0f / (bwest_str->rec_bw +
                                    bwest_str->rec_header_rate);

    bwest_str->count_tot_updates_rec = 1;

    immediate_set = 0;
    bwest_str->consecLatency = 0;
    bwest_str->numConsecLatePkts = 0;
  }

  return 0;
}